

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O2

void __thiscall
chrono::ChGlyphs::SetGlyphPoint(ChGlyphs *this,uint id,ChVector<double> *mpoint,ChColor *mcolor)

{
  float fVar1;
  ChVector<double> *pCVar2;
  ChColor *pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  ulong uVar6;
  
  pCVar4 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)id;
  if ((ulong)(((long)(this->points).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0x18) <= uVar6) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar4 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar2 = pCVar4 + uVar6;
  if (pCVar2 != mpoint) {
    pCVar2->m_data[0] = mpoint->m_data[0];
    pCVar2->m_data[1] = mpoint->m_data[1];
    pCVar2->m_data[2] = mpoint->m_data[2];
  }
  pCVar5 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->colors).
                     super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar5) / 0xc) <= uVar6) {
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
              (&this->colors,(ulong)(id + 1));
    pCVar5 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pCVar3 = pCVar5 + uVar6;
  if (pCVar3 != mcolor) {
    fVar1 = mcolor->G;
    pCVar3->R = mcolor->R;
    pCVar3->G = fVar1;
    pCVar3->B = mcolor->B;
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphPoint(unsigned int id, ChVector<> mpoint, ChColor mcolor) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mpoint;

    if (colors.size() <= id)
        colors.resize(id + 1);
    colors[id] = mcolor;
}